

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O1

void __thiscall
soul::RewritingASTVisitor::replaceExpression
          (RewritingASTVisitor *this,pool_ptr<soul::AST::Expression> *e)

{
  pool_ptr<soul::AST::Expression> local_20;
  
  if ((e->object != (Expression *)0x0) &&
     ((*this->_vptr_RewritingASTVisitor[2])(&local_20,this), e->object != local_20.object)) {
    this->itemsReplaced = this->itemsReplaced + 1;
    e->object = (Expression *)local_20;
  }
  return;
}

Assistant:

bool operator!= (decltype (nullptr)) const noexcept     { return object != nullptr; }